

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureDivision.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::StructureDivision::
StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (StructureDivision *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *it,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *end,long *lineNumber)

{
  long lVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  undefined8 *puVar3;
  char *args;
  Tail *pTVar4;
  array<int,_3UL> aVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  record::
  Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
  ::Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((Base<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>
              *)this,it,end);
  aVar5 = record::Tail::read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(it,end);
  *&(this->tail).fields._M_elems = aVar5._M_elems;
  *lineNumber = *lineNumber + 1;
  if (aVar5._M_elems[0] < -1) {
    tools::Log::error<char_const*>("Illegal material number (MAT) encountered");
    lVar1 = *lineNumber;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (begin._M_current,end->_M_current);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_50,begin._M_current,_Var2._M_current);
    tools::Log::info<char_const*,long,std::__cxx11::string>
              ("Error parsing line {}: \"{}\"",lVar1 + -1,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    tools::Log::info<char_const*>("Material numbers are greater than or equal to -1");
    pTVar4 = &this->tail;
    args = "Material number: {}";
  }
  else if (aVar5._M_elems._0_8_ < 0) {
    tools::Log::error<char_const*>("Illegal file number (MF) encountered");
    lVar1 = *lineNumber;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (begin._M_current,end->_M_current);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_70,begin._M_current,_Var2._M_current);
    tools::Log::info<char_const*,long,std::__cxx11::string>
              ("Error parsing line {}: \"{}\"",lVar1 + -1,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    tools::Log::info<char_const*>("File numbers are greater than or equal to 0");
    pTVar4 = (Tail *)((this->tail).fields._M_elems + 1);
    args = "File number: {}";
  }
  else {
    if (-1 < aVar5._M_elems[2]) {
      return;
    }
    tools::Log::error<char_const*>("Illegal section number (MT) encountered");
    lVar1 = *lineNumber;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (begin._M_current,end->_M_current);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_90,begin._M_current,_Var2._M_current);
    tools::Log::info<char_const*,long,std::__cxx11::string>
              ("Error parsing line {}: \"{}\"",lVar1 + -1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    tools::Log::info<char_const*>("Section numbers are greater than or equal to 0");
    pTVar4 = (Tail *)((this->tail).fields._M_elems + 2);
    args = "Section number: {}";
  }
  tools::Log::info<char_const*,int>(args,(pTVar4->fields)._M_elems[0]);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = getenv;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

StructureDivision
    ( Iterator begin, Iterator& it, const Iterator& end, long& lineNumber )
      try : base( it, end ), tail( it, end, lineNumber ) {

        if (tail.material() < -1) {

          Log::error( "Illegal material number (MAT) encountered" );
          Log::info( "Error parsing line {}: \"{}\"",
                     lineNumber - 1,
                     std::string( begin, std::find( begin, end, '\n' ) ) );
          Log::info( "Material numbers are greater than or equal to -1" );
          Log::info( "Material number: {}", this->tail.material() );
          throw std::exception();
        }
        if (tail.file() < 0) {

          Log::error( "Illegal file number (MF) encountered" );
          Log::info( "Error parsing line {}: \"{}\"",
                     lineNumber - 1,
                     std::string( begin, std::find( begin, end, '\n' ) ) );
          Log::info( "File numbers are greater than or equal to 0" );
          Log::info( "File number: {}", this->tail.file() );
          throw std::exception();
        }
        if (tail.section() < 0) {

          Log::error( "Illegal section number (MT) encountered" );
          Log::info( "Error parsing line {}: \"{}\"",
                     lineNumber - 1,
                     std::string( begin, std::find( begin, end, '\n' ) ) );
          Log::info( "Section numbers are greater than or equal to 0" );
          Log::info( "Section number: {}", this->tail.section() );
          throw std::exception();
        }
      }
      catch ( int fieldNumber ) {

        switch (fieldNumber) {
        case 6 :

          Log::error( "Illegal material number (MAT) encountered" );
          Log::info( "Error while parsing line {}:", lineNumber - 1 );
          Log::info( "Line {}:", std::string( begin, std::find( begin, end, '\n' ) ) );
          break;
        case 7 :

          Log::error( "Illegal file number (MF) encountered" );
          Log::info( "Error while parsing line {}:", lineNumber - 1 );
          Log::info( "Line {}:", std::string( begin, std::find( begin, end, '\n' ) ) );
          break;
        case 8 :

          Log::error( "Illegal section number (MT) encountered" );
          Log::info( "Error while parsing line {}:", lineNumber - 1 );
          Log::info( "Line {}:", std::string( begin, std::find( begin, end, '\n' ) ) );
          break;
        default:
          break;
        }
        throw std::exception();
      }
      catch ( std::exception& e ) {

        Log::info( "Error encountered while constructing structure division" );
        throw e;
      }